

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vec.h
# Opt level: O2

double __thiscall
crnlib::vec<1U,_float>::normalize(vec<1U,_float> *this,vec<1U,_float> *pDefaultVec)

{
  double dVar1;
  float fVar2;
  float fVar3;
  
  fVar2 = this->m_s[0];
  fVar3 = fVar2 * fVar2;
  dVar1 = (double)fVar3;
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar2 = fVar2 * (float)(1.0 / SQRT(dVar1));
  }
  else {
    if (this == pDefaultVec || pDefaultVec == (vec<1U,_float> *)0x0) {
      return dVar1;
    }
    fVar2 = pDefaultVec->m_s[0];
  }
  this->m_s[0] = fVar2;
  return dVar1;
}

Assistant:

inline double normalize(const vec* pDefaultVec = nullptr) {
            double n = m_s[0] * m_s[0];
            for (uint i = 1; i < N; i++)
            {
                n += m_s[i] * m_s[i];
            }

            if (n != 0)
            {
                *this *= static_cast<T>((1.0f / sqrt(n)));
            }
            else if (pDefaultVec)
            {
                *this = *pDefaultVec;
            }
            return n;
        }